

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdevicediscovery_udev.cpp
# Opt level: O2

bool __thiscall QDeviceDiscoveryUDev::checkDeviceType(QDeviceDiscoveryUDev *this,udev_device *dev)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  quint64 qVar5;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  bool ok;
  undefined7 uStack_97;
  undefined8 local_90;
  QArrayDataPointer<QStringView> local_88;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (dev != (udev_device *)0x0) {
    if (((byte)this[0x10] & 8) != 0) {
      pcVar4 = (char *)udev_device_get_property_value(dev,"ID_INPUT_KEYBOARD");
      iVar3 = qstrcmp(pcVar4,"1");
      if (iVar3 != 0) goto LAB_00137cb5;
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d._0_4_ = 0xaaaaaaaa;
      local_58.d._4_4_ = 0xaaaaaaaa;
      local_58.ptr._0_4_ = 0xaaaaaaaa;
      local_58.ptr._4_4_ = 0xaaaaaaaa;
      local_88.d = (Data *)udev_device_get_sysattr_value(dev,"capabilities/key");
      QByteArrayView::QByteArrayView<const_char_*,_true>(&local_68,(char **)&local_88);
      QVar6.m_data = (storage_type *)local_68.m_size;
      QVar6.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar6);
      local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_88.ptr._0_4_ = 0xaaaaaaaa;
      local_88.ptr._4_4_ = 0xaaaaaaaa;
      local_90 = CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
      _ok = (undefined1 *)local_58.size;
      QStringView::split(&local_88,&ok,0x20,1,1);
      if ((undefined1 *)local_88.size == (undefined1 *)0x0) {
LAB_00137ca1:
        QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
        goto LAB_00137cb5;
      }
      _ok = (undefined1 *)CONCAT71(uStack_97,0xaa);
      qVar5 = QStringView::toULongLong
                        ((QStringView *)
                         (CONCAT44(local_88.ptr._4_4_,local_88.ptr._0_4_) + local_88.size * 0x10 +
                         -0x10),&ok,0x10);
      if ((((uint)qVar5 >> 0x10 & 1) == 0) || (ok == false)) goto LAB_00137ca1;
      QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_00137de4:
      bVar2 = true;
      goto LAB_00137de6;
    }
LAB_00137cb5:
    uVar1 = *(uint *)(this + 0x10);
    if ((uVar1 & 8) != 0) {
      pcVar4 = (char *)udev_device_get_property_value(dev,"ID_INPUT_KEY");
      iVar3 = qstrcmp(pcVar4,"1");
      if (iVar3 == 0) goto LAB_00137de4;
      uVar1 = *(uint *)(this + 0x10);
    }
    if ((uVar1 & 1) != 0) {
      pcVar4 = (char *)udev_device_get_property_value(dev,"ID_INPUT_MOUSE");
      iVar3 = qstrcmp(pcVar4,"1");
      if (iVar3 == 0) goto LAB_00137de4;
      uVar1 = *(uint *)(this + 0x10);
    }
    if ((uVar1 & 2) != 0) {
      pcVar4 = (char *)udev_device_get_property_value(dev,"ID_INPUT_TOUCHPAD");
      iVar3 = qstrcmp(pcVar4,"1");
      if (iVar3 == 0) goto LAB_00137de4;
      uVar1 = *(uint *)(this + 0x10);
    }
    if ((uVar1 & 4) != 0) {
      pcVar4 = (char *)udev_device_get_property_value(dev,"ID_INPUT_TOUCHSCREEN");
      iVar3 = qstrcmp(pcVar4,"1");
      if (iVar3 == 0) goto LAB_00137de4;
      uVar1 = *(uint *)(this + 0x10);
    }
    if ((uVar1 & 0x40) != 0) {
      pcVar4 = (char *)udev_device_get_property_value(dev,"ID_INPUT_TABLET");
      iVar3 = qstrcmp(pcVar4,"1");
      if (iVar3 == 0) goto LAB_00137de4;
      uVar1 = *(uint *)(this + 0x10);
    }
    if ((char)uVar1 < '\0') {
      pcVar4 = (char *)udev_device_get_property_value(dev,"ID_INPUT_JOYSTICK");
      iVar3 = qstrcmp(pcVar4,"1");
      if (iVar3 == 0) goto LAB_00137de4;
      uVar1 = *(uint *)(this + 0x10);
    }
    if ((uVar1 & 0x10) != 0) {
      pcVar4 = (char *)udev_device_get_subsystem(dev);
      iVar3 = qstrcmp(pcVar4,"drm");
      if (iVar3 == 0) goto LAB_00137de4;
    }
  }
  bVar2 = false;
LAB_00137de6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QDeviceDiscoveryUDev::checkDeviceType(udev_device *dev)
{
    if (!dev)
        return false;

    if ((m_types & Device_Keyboard) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_KEYBOARD"), "1") == 0 )) {
        const QString capabilities_key = QString::fromUtf8(udev_device_get_sysattr_value(dev, "capabilities/key"));
        const auto val = QStringView{capabilities_key}.split(u' ', Qt::SkipEmptyParts);
        if (!val.isEmpty()) {
            bool ok;
            unsigned long long keys = val.last().toULongLong(&ok, 16);
            if (ok) {
                // Tests if the letter Q is valid for the device.  We may want to alter this test, but it seems mostly reliable.
                bool test = (keys >> KEY_Q) & 1;
                if (test)
                    return true;
            }
        }
    }

    if ((m_types & Device_Keyboard) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_KEY"), "1") == 0 ))
        return true;

    if ((m_types & Device_Mouse) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_MOUSE"), "1") == 0))
        return true;

    if ((m_types & Device_Touchpad) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TOUCHPAD"), "1") == 0))
        return true;

    if ((m_types & Device_Touchscreen) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TOUCHSCREEN"), "1") == 0))
        return true;

    if ((m_types & Device_Tablet) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_TABLET"), "1") == 0))
        return true;

    if ((m_types & Device_Joystick) && (qstrcmp(udev_device_get_property_value(dev, "ID_INPUT_JOYSTICK"), "1") == 0))
        return true;

    if ((m_types & Device_DRM) && (qstrcmp(udev_device_get_subsystem(dev), "drm") == 0))
        return true;

    return false;
}